

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

StringPtr __thiscall kj::HttpHeaders::cloneToOwn(HttpHeaders *this,StringPtr str)

{
  RemoveConst<kj::Array<char>_> *pRVar1;
  char *pcVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  RemoveConst<kj::Array<char>_> *pRVar5;
  char *pcVar6;
  size_t sVar7;
  StringPtr SVar8;
  String copy;
  String local_58;
  char *local_40;
  size_t local_38;
  ArrayDisposer *local_30;
  
  heapString(&local_58,str.content.ptr,str.content.size_ - 1);
  pAVar4 = local_58.content.disposer;
  sVar3 = local_58.content.size_;
  pcVar6 = local_58.content.ptr;
  local_40 = local_58.content.ptr;
  local_38 = local_58.content.size_;
  local_30 = local_58.content.disposer;
  local_58.content.ptr = (char *)0x0;
  local_58.content.size_ = 0;
  pRVar5 = (this->ownedStrings).builder.pos;
  if (pRVar5 == (this->ownedStrings).builder.endPtr) {
    pRVar1 = (this->ownedStrings).builder.ptr;
    sVar7 = 4;
    if (pRVar5 != pRVar1) {
      sVar7 = ((long)pRVar5 - (long)pRVar1 >> 3) * 0x5555555555555556;
    }
    Vector<kj::Array<char>_>::setCapacity(&this->ownedStrings,sVar7);
    pRVar5 = (this->ownedStrings).builder.pos;
  }
  sVar7 = local_58.content.size_;
  pcVar2 = local_58.content.ptr;
  pRVar5->ptr = pcVar6;
  pRVar5->size_ = sVar3;
  pRVar5->disposer = pAVar4;
  (this->ownedStrings).builder.pos = pRVar5 + 1;
  if (local_58.content.ptr != (char *)0x0) {
    local_58.content.ptr = (char *)0x0;
    local_58.content.size_ = 0;
    (**(local_58.content.disposer)->_vptr_ArrayDisposer)
              (local_58.content.disposer,pcVar2,1,sVar7,sVar7,0);
  }
  SVar8.content.size_ = sVar3 + (sVar3 == 0);
  if (sVar3 == 0) {
    pcVar6 = "";
  }
  SVar8.content.ptr = pcVar6;
  return (StringPtr)SVar8.content;
}

Assistant:

kj::StringPtr HttpHeaders::cloneToOwn(kj::StringPtr str) {
  auto copy = kj::heapString(str);
  kj::StringPtr result = copy;
  ownedStrings.add(copy.releaseArray());
  return result;
}